

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingSymbol
          (DescriptorPoolDatabase *this,StringViewArg symbol_name,FileDescriptorProto *output)

{
  DescriptorPool *this_00;
  string_view symbol_name_00;
  FileDescriptor *this_01;
  FileDescriptor *file;
  FileDescriptorProto *output_local;
  StringViewArg symbol_name_local;
  DescriptorPoolDatabase *this_local;
  
  this_00 = this->pool_;
  symbol_name_00 =
       (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)symbol_name);
  this_01 = DescriptorPool::FindFileContainingSymbol(this_00,symbol_name_00);
  if (this_01 == (FileDescriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    FileDescriptorProto::Clear(output);
    FileDescriptor::CopyTo(this_01,output);
    if (((this->options_).preserve_source_code_info & 1U) != 0) {
      FileDescriptor::CopySourceCodeInfoTo(this_01,output);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingSymbol(
    StringViewArg symbol_name, FileDescriptorProto* PROTOBUF_NONNULL output) {
  const FileDescriptor* file = pool_.FindFileContainingSymbol(symbol_name);
  if (file == nullptr) return false;
  output->Clear();
  file->CopyTo(output);
  if (options_.preserve_source_code_info) {
    file->CopySourceCodeInfoTo(output);
  }
  return true;
}